

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

char * ImStrdupcpy(char *dst,size_t *p_dst_size,char *src)

{
  void *pvVar1;
  size_t sVar2;
  void *__n;
  char *in_RDX;
  ulong *in_RSI;
  char *in_RDI;
  size_t src_size;
  size_t dst_buf_size;
  void *ptr;
  undefined8 local_8;
  
  if (in_RSI == (ulong *)0x0) {
    sVar2 = strlen(in_RDI);
    pvVar1 = (void *)(sVar2 + 1);
  }
  else {
    pvVar1 = (void *)*in_RSI;
  }
  ptr = pvVar1;
  sVar2 = strlen(in_RDX);
  __n = (void *)(sVar2 + 1);
  local_8 = in_RDI;
  if (pvVar1 < __n) {
    ImGui::MemFree(ptr);
    local_8 = (char *)ImGui::MemAlloc((size_t)ptr);
    if (in_RSI != (ulong *)0x0) {
      *in_RSI = (ulong)__n;
    }
  }
  memcpy(local_8,in_RDX,(size_t)__n);
  return local_8;
}

Assistant:

char* ImStrdupcpy(char* dst, size_t* p_dst_size, const char* src)
{
    size_t dst_buf_size = p_dst_size ? *p_dst_size : strlen(dst) + 1;
    size_t src_size = strlen(src) + 1;
    if (dst_buf_size < src_size)
    {
        IM_FREE(dst);
        dst = (char*)IM_ALLOC(src_size);
        if (p_dst_size)
            *p_dst_size = src_size;
    }
    return (char*)memcpy(dst, (const void*)src, src_size);
}